

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,char_type value)

{
  format_specs *pfVar1;
  char_spec_handler local_18;
  
  pfVar1 = this->specs_;
  local_18.formatter = this;
  local_18.value = value;
  if (pfVar1 != (format_specs *)0x0) {
    if ((pfVar1->type != '\0') && (pfVar1->type != 'c')) {
      char_spec_handler::on_int(&local_18);
      goto LAB_00151f37;
    }
    if ((0xf < (byte)pfVar1->field_0x9) || ((pfVar1->field_0x9 & 0xf) == 4)) {
      error_handler::on_error((error_handler *)this,"invalid format specifier for char");
    }
  }
  write_char(this,value);
LAB_00151f37:
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(char_type value) {
    internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    return out();
  }